

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# buffer_block.cpp
# Opt level: O3

void __thiscall cppnet::BufferBlock::~BufferBlock(BufferBlock *this)

{
  ~BufferBlock(this);
  operator_delete(this);
  return;
}

Assistant:

BufferBlock::~BufferBlock() {
    if (_buffer_start) {
        auto alloter = _alloter.lock();
        if (alloter) {
            void* m = (void*)_buffer_start;
            alloter->PoolLargeFree(m);
        }
    }
}